

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall QHeaderView::mouseDoubleClickEvent(QHeaderView *this,QMouseEvent *e)

{
  Orientation OVar1;
  QHeaderViewPrivate *this_00;
  bool bVar2;
  ResizeMode RVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  double dVar6;
  undefined1 auVar7 [16];
  int local_4c;
  QCursor local_48;
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  OVar1 = this_00->orientation;
  auVar7 = QEventPoint::position();
  dVar6 = auVar7._0_8_;
  if (OVar1 != Horizontal) {
    dVar6 = auVar7._8_8_;
  }
  dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar6;
  bVar2 = 2147483647.0 < dVar6;
  if (dVar6 <= -2147483648.0) {
    dVar6 = -2147483648.0;
  }
  iVar5 = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar6);
  local_4c = QHeaderViewPrivate::sectionHandleAt(this_00,iVar5);
  if (-1 < local_4c) {
    RVar3 = sectionResizeMode(this,local_4c);
    if (RVar3 == Interactive) {
      local_40 = &local_4c;
      local_48.d = (QCursorData *)0x0;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,&local_48.d);
      OVar1 = this_00->orientation;
      QWidget::cursor((QWidget *)&local_48);
      iVar4 = QCursor::shape();
      QCursor::~QCursor(&local_48);
      if (iVar4 == (OVar1 == Horizontal) + 0xb) {
        iVar5 = QHeaderViewPrivate::sectionHandleAt(this_00,iVar5);
        if (-1 < iVar5) {
          RVar3 = sectionResizeMode(this,iVar5);
          if (RVar3 == Interactive) goto LAB_0054f3bf;
        }
        QCursor::QCursor(&local_48,ArrowCursor);
        QWidget::setCursor((QWidget *)this,&local_48);
        QCursor::~QCursor(&local_48);
      }
      goto LAB_0054f3bf;
    }
  }
  auVar7 = QEventPoint::position();
  if (*(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget.field_0x8 + 0x548) == 1) {
    dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
  }
  else {
    dVar6 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
  }
  bVar2 = 2147483647.0 < dVar6;
  if (dVar6 <= -2147483648.0) {
    dVar6 = -2147483648.0;
  }
  local_4c = logicalIndexAt(this,(int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                              ~-(ulong)bVar2 & (ulong)dVar6));
  local_40 = &local_4c;
  local_48.d = (QCursorData *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,5,&local_48.d);
LAB_0054f3bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::mouseDoubleClickEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    int handle = d->sectionHandleAt(pos);
    if (handle > -1 && sectionResizeMode(handle) == Interactive) {
        emit sectionHandleDoubleClicked(handle);
#ifndef QT_NO_CURSOR
        Qt::CursorShape splitCursor = (d->orientation == Qt::Horizontal)
                                      ? Qt::SplitHCursor : Qt::SplitVCursor;
        if (cursor().shape() == splitCursor) {
            // signal handlers may have changed the section size
            handle = d->sectionHandleAt(pos);
            if (!(handle > -1 && sectionResizeMode(handle) == Interactive))
                setCursor(Qt::ArrowCursor);
        }
#endif
    } else {
        emit sectionDoubleClicked(logicalIndexAt(e->position().toPoint()));
    }
}